

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

int socketio_open(CONCRETE_IO_HANDLE socket_io,ON_IO_OPEN_COMPLETE on_io_open_complete,
                 void *on_io_open_complete_context,ON_BYTES_RECEIVED on_bytes_received,
                 void *on_bytes_received_context,ON_IO_ERROR on_io_error,void *on_io_error_context)

{
  LOGGER_LOG p_Var1;
  IO_OPEN_RESULT IVar2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  SOCKET_IO_INSTANCE *socket_io_instance;
  int result;
  ON_IO_ERROR on_io_error_local;
  void *on_bytes_received_context_local;
  ON_BYTES_RECEIVED on_bytes_received_local;
  void *on_io_open_complete_context_local;
  ON_IO_OPEN_COMPLETE on_io_open_complete_local;
  CONCRETE_IO_HANDLE socket_io_local;
  
  if (socket_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/socketio_berkeley.c"
                ,"socketio_open",0x358,1,"Invalid argument: SOCKET_IO_INSTANCE is NULL");
    }
    socket_io_instance._4_4_ = 0x359;
  }
  else if (*(int *)((long)socket_io + 0x50) == 0) {
    if (*socket_io == -1) {
      socket_io_instance._4_4_ =
           lookup_address_and_initiate_socket_connection((SOCKET_IO_INSTANCE *)socket_io);
      if (socket_io_instance._4_4_ == 0) {
        if ((*(int *)((long)socket_io + 0x50) == 2) &&
           (socket_io_instance._4_4_ = wait_for_socket_connection((SOCKET_IO_INSTANCE *)socket_io),
           socket_io_instance._4_4_ != 0)) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/socketio_berkeley.c"
                      ,"socketio_open",0x376,1,"wait_for_socket_connection failed");
          }
        }
        else {
          *(ON_BYTES_RECEIVED *)((long)socket_io + 8) = on_bytes_received;
          *(void **)((long)socket_io + 0x20) = on_bytes_received_context;
          *(ON_IO_ERROR *)((long)socket_io + 0x10) = on_io_error;
          *(void **)((long)socket_io + 0x28) = on_io_error_context;
          *(ON_IO_OPEN_COMPLETE *)((long)socket_io + 0x18) = on_io_open_complete;
          *(void **)((long)socket_io + 0x30) = on_io_open_complete_context;
        }
      }
      else {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/socketio_berkeley.c"
                    ,"socketio_open",0x372,1,"lookup_address_and_connect_socket failed");
        }
      }
    }
    else {
      *(void **)((long)socket_io + 0x20) = on_bytes_received_context;
      *(ON_BYTES_RECEIVED *)((long)socket_io + 8) = on_bytes_received;
      *(ON_IO_ERROR *)((long)socket_io + 0x10) = on_io_error;
      *(void **)((long)socket_io + 0x28) = on_io_error_context;
      *(undefined4 *)((long)socket_io + 0x50) = 2;
      socket_io_instance._4_4_ = 0;
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/socketio_berkeley.c"
                ,"socketio_open",0x35f,1,"Failure: socket state is not closed.");
    }
    socket_io_instance._4_4_ = 0x360;
  }
  if ((*(int *)((long)socket_io + 0x50) != 1) && (on_io_open_complete != (ON_IO_OPEN_COMPLETE)0x0))
  {
    IVar2 = IO_OPEN_ERROR;
    if (socket_io_instance._4_4_ == 0) {
      IVar2 = IO_OPEN_OK;
    }
    (*on_io_open_complete)(on_io_open_complete_context,IVar2);
  }
  return socket_io_instance._4_4_;
}

Assistant:

int socketio_open(CONCRETE_IO_HANDLE socket_io, ON_IO_OPEN_COMPLETE on_io_open_complete, void* on_io_open_complete_context, ON_BYTES_RECEIVED on_bytes_received, void* on_bytes_received_context, ON_IO_ERROR on_io_error, void* on_io_error_context)
{
    int result;

    SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)socket_io;
    if (socket_io == NULL)
    {
        LogError("Invalid argument: SOCKET_IO_INSTANCE is NULL");
        result = MU_FAILURE;
    }
    else
    {
        if (socket_io_instance->io_state != IO_STATE_CLOSED)
        {
            LogError("Failure: socket state is not closed.");
            result = MU_FAILURE;
        }
        else if (socket_io_instance->socket != INVALID_SOCKET)
        {
            // Opening an accepted socket
            socket_io_instance->on_bytes_received_context = on_bytes_received_context;
            socket_io_instance->on_bytes_received = on_bytes_received;
            socket_io_instance->on_io_error = on_io_error;
            socket_io_instance->on_io_error_context = on_io_error_context;

            socket_io_instance->io_state = IO_STATE_OPEN;

            result = 0;
        }
        else
        {
            if ((result = lookup_address_and_initiate_socket_connection(socket_io_instance)) != 0)
            {
                LogError("lookup_address_and_connect_socket failed");
            }
            else if ((socket_io_instance->io_state == IO_STATE_OPEN) && (result = wait_for_socket_connection(socket_io_instance)) != 0)
            {
                LogError("wait_for_socket_connection failed");
            } 
            else
            {
                socket_io_instance->on_bytes_received = on_bytes_received;
                socket_io_instance->on_bytes_received_context = on_bytes_received_context;

                socket_io_instance->on_io_error = on_io_error;
                socket_io_instance->on_io_error_context = on_io_error_context;

                socket_io_instance->on_io_open_complete = on_io_open_complete;
                socket_io_instance->on_io_open_complete_context = on_io_open_complete_context;
            }
        }
    }

    if (socket_io_instance->io_state != IO_STATE_OPENING)
    {
        if (on_io_open_complete != NULL)
        {
            on_io_open_complete(on_io_open_complete_context, result == 0 ? IO_OPEN_OK : IO_OPEN_ERROR);
        }
    }

    return result;
}